

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool el::Configurations::Parser::parseFromText
               (string *configurationsString,Configurations *sender,Configurations *base)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  Level currLevel;
  string currLevelStr;
  string currConfigStr;
  string line;
  string local_360 [32];
  stringstream internalInfoStream;
  ostream local_330 [376];
  stringstream ss;
  
  setFromBase(sender,base);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&ss,(string *)configurationsString,_S_out|_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  bVar1 = false;
  line.field_2._M_local_buf[0] = '\0';
  currConfigStr._M_dataplus._M_p = (pointer)&currConfigStr.field_2;
  currConfigStr._M_string_length = 0;
  currLevelStr._M_dataplus._M_p = (pointer)&currLevelStr.field_2;
  currLevelStr._M_string_length = 0;
  currLevel = Unknown;
  currConfigStr.field_2._M_local_buf[0] = '\0';
  currLevelStr.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = parseLine(&line,&currConfigStr,&currLevelStr,&currLevel,sender);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&internalInfoStream);
      poVar3 = std::operator<<(local_330,"Unable to parse configuration line: ");
      std::operator<<(poVar3,(string *)&line);
      poVar3 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x168);
      poVar3 = std::operator<<(poVar3,") [parsedSuccessfully");
      poVar3 = std::operator<<(poVar3,"] WITH MESSAGE \"");
      std::__cxx11::stringbuf::str();
      poVar3 = std::operator<<(poVar3,local_360);
      poVar3 = std::operator<<(poVar3,"\"");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::stringstream::~stringstream((stringstream *)&internalInfoStream);
    }
  }
  std::__cxx11::string::~string((string *)&currLevelStr);
  std::__cxx11::string::~string((string *)&currConfigStr);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar1;
}

Assistant:

bool Configurations::Parser::parseFromText(const std::string& configurationsString, Configurations* sender,
    Configurations* base) {
  sender->setFromBase(base);
  bool parsedSuccessfully = false;
  std::stringstream ss(configurationsString);
  std::string line = std::string();
  Level currLevel = Level::Unknown;
  std::string currConfigStr = std::string();
  std::string currLevelStr = std::string();
  while (std::getline(ss, line)) {
    parsedSuccessfully = parseLine(&line, &currConfigStr, &currLevelStr, &currLevel, sender);
    ELPP_ASSERT(parsedSuccessfully, "Unable to parse configuration line: " << line);
  }
  return parsedSuccessfully;
}